

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<unsigned_char>::add_node
          (CATNMachine<unsigned_char> *this,CharClass<unsigned_char> *cc,int origin,int tag)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  int tag_local;
  int origin_local;
  CharClass<unsigned_char> *cc_local;
  CATNMachine<unsigned_char> *this_local;
  
  bVar1 = std::
          vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
          ::empty(&this->m_nodes);
  if ((!bVar1) && (-1 < origin)) {
    this_00 = std::
              vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
              ::operator[](&this->m_nodes,(long)origin);
    sVar2 = std::
            vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
            ::size(&this->m_nodes);
    CATNNode<unsigned_char>::add_transition(this_00,cc,(int)sVar2,tag);
  }
  std::
  vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>::
  emplace_back<>(&this->m_nodes);
  sVar2 = std::
          vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
          ::size(&this->m_nodes);
  return (int)sVar2 + -1;
}

Assistant:

int add_node(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        if (!m_nodes.empty() && origin >= 0)
            m_nodes[origin].add_transition(cc, m_nodes.size(), tag);
        m_nodes.emplace_back();
        return m_nodes.size() - 1;
    }